

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
::write_decimal<int>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
           *this,int value)

{
  basic_buffer<wchar_t> *pbVar1;
  size_t sVar2;
  char *pcVar3;
  byte bVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  wchar_t *pwVar11;
  ulong uVar12;
  char_type buffer [13];
  char acStack_3d [13];
  
  uVar8 = (ulong)(uint)-value;
  if (0 < value) {
    uVar8 = (ulong)(uint)value;
  }
  uVar6 = (uint)uVar8;
  uVar9 = 0x1f;
  if ((uVar6 | 1) != 0) {
    for (; (uVar6 | 1) >> uVar9 == 0; uVar9 = uVar9 - 1) {
    }
  }
  uVar9 = (uVar9 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  uVar9 = (uVar9 - (uVar6 < *(uint *)(internal::basic_data<void>::ZERO_OR_POWERS_OF_10_32 +
                                     (ulong)uVar9 * 4))) + 1;
  uVar10 = (ulong)uVar9;
  pbVar1 = (this->out_).container;
  sVar2 = pbVar1->size_;
  uVar12 = ((uint)value >> 0x1f) + sVar2 + uVar10;
  if (pbVar1->capacity_ < uVar12) {
    (**pbVar1->_vptr_basic_buffer)(pbVar1,uVar12);
  }
  pwVar11 = pbVar1->ptr_ + sVar2;
  pbVar1->size_ = uVar12;
  if (value < 0) {
    *pwVar11 = L'-';
    pwVar11 = pwVar11 + 1;
  }
  pcVar3 = acStack_3d + uVar10;
  if (99 < uVar6) {
    do {
      uVar7 = (uint)uVar8;
      uVar6 = (uint)(uVar8 / 100);
      uVar8 = uVar8 / 100;
      *(undefined2 *)(pcVar3 + -2) =
           *(undefined2 *)
            (internal::basic_data<void>::DIGITS + (ulong)(uVar7 + (int)uVar8 * -100) * 2);
      pcVar3 = pcVar3 + -2;
    } while (9999 < uVar7);
  }
  if (uVar6 < 10) {
    bVar4 = (byte)uVar6 | 0x30;
    lVar5 = -1;
  }
  else {
    pcVar3[-1] = internal::basic_data<void>::DIGITS[((ulong)uVar6 * 2 & 0xffffffff) + 1];
    bVar4 = internal::basic_data<void>::DIGITS[(ulong)uVar6 * 2];
    lVar5 = -2;
  }
  pcVar3[lVar5] = bVar4;
  if (0 < (int)uVar9) {
    uVar8 = 0;
    do {
      pwVar11[uVar8] = (int)acStack_3d[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar10 != uVar8);
  }
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }